

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O0

void InitialEntropyCodesCommand
               (uint16_t *data,size_t length,size_t stride,size_t num_histograms,
               HistogramCommand *histograms)

{
  void *__s;
  ulong in_RCX;
  long in_RDX;
  long lVar1;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  size_t pos;
  size_t i;
  size_t block_length;
  uint32_t seed;
  size_t i_1;
  ulong local_88;
  ulong local_80;
  ulong local_38;
  long local_20;
  ushort *local_18;
  
  for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
    __s = (void *)(in_R8 + local_38 * 0xb10);
    memset(__s,0,0xb00);
    *(undefined8 *)((long)__s + 0xb00) = 0;
    *(undefined8 *)((long)__s + 0xb08) = 0x7ff0000000000000;
  }
  for (local_80 = 0; local_80 < in_RCX; local_80 = local_80 + 1) {
    local_88 = (in_RSI * local_80) / in_RCX;
    if (local_80 != 0) {
      local_88 = 7U % (in_RSI / in_RCX) + local_88;
    }
    if (in_RSI <= local_88 + in_RDX) {
      local_88 = (in_RSI - in_RDX) - 1;
    }
    lVar1 = in_R8 + local_80 * 0xb10;
    *(long *)(lVar1 + 0xb00) = in_RDX + *(long *)(lVar1 + 0xb00);
    local_20 = in_RDX + 1;
    local_18 = (ushort *)(in_RDI + local_88 * 2);
    while (local_20 = local_20 + -1, local_20 != 0) {
      *(int *)(lVar1 + (ulong)*local_18 * 4) = *(int *)(lVar1 + (ulong)*local_18 * 4) + 1;
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

static void FN(InitialEntropyCodes)(const DataType* data, size_t length,
                                    size_t stride,
                                    size_t num_histograms,
                                    HistogramType* histograms) {
  uint32_t seed = 7;
  size_t block_length = length / num_histograms;
  size_t i;
  FN(ClearHistograms)(histograms, num_histograms);
  for (i = 0; i < num_histograms; ++i) {
    size_t pos = length * i / num_histograms;
    if (i != 0) {
      pos += MyRand(&seed) % block_length;
    }
    if (pos + stride >= length) {
      pos = length - stride - 1;
    }
    FN(HistogramAddVector)(&histograms[i], data + pos, stride);
  }
}